

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_test.cc
# Opt level: O3

void xLearn::write_data(string *filename,string *data)

{
  bool bVar1;
  FILE *__s;
  size_t sVar2;
  int iVar3;
  char *message;
  uint32 write_len;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  uint local_4c;
  internal local_48 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  AssertHelper local_38;
  
  __s = (FILE *)OpenFileOrDie((filename->_M_dataplus)._M_p,"w");
  iVar3 = 100000;
  do {
    sVar2 = fwrite((data->_M_dataplus)._M_p,1,data->_M_string_length,__s);
    local_4c = (uint)sVar2;
    local_58.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         data->_M_string_length;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              (local_48,"write_len","data.size()",&local_4c,(unsigned_long *)&local_58);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_58);
      message = "";
      if (local_40.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        message = ((local_40.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/reader_test.cc"
                 ,0x3b,message);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_58);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      if (local_58.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_58.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_58.ptr_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  Close((FILE *)__s);
  return;
}

Assistant:

void write_data(const std::string& filename,
                const std::string& data) {
  FILE* file = OpenFileOrDie(filename.c_str(), "w");
  for (index_t i = 0; i < kNumLines; ++i) {
    uint32 write_len = fwrite(data.c_str(), 1, data.size(), file);
    EXPECT_EQ(write_len, data.size());
  }
  Close(file);
}